

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cpp
# Opt level: O3

void __thiscall
PythonGenerator::stdVectorToString
          (PythonGenerator *this,vector<double,_std::allocator<double>_> *toConvert,string *result)

{
  int iVar1;
  pointer pdVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  string num2str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pdVar2 = (toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  iVar1 = (int)(uVar3 >> 3);
  uVar4 = iVar1 - 1;
  if (1 < iVar1) {
    uVar5 = 0;
    do {
      pdVar2 = (toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar5)
      goto LAB_0010794e;
      doubleToString_abi_cxx11_(&local_70,pdVar2[uVar5]);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::_M_append((char *)result,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    pdVar2 = (toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(toConvert->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
  }
  uVar5 = (ulong)(int)uVar4;
  if (uVar5 < (ulong)((long)uVar3 >> 3)) {
    doubleToString_abi_cxx11_(&local_70,pdVar2[uVar5]);
    std::__cxx11::string::_M_append((char *)result,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return;
  }
LAB_0010794e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

void PythonGenerator::stdVectorToString(std::vector<double> toConvert, std::string& result)
{
    int toConvertSize = toConvert.size();
    for(int i = 0; i < toConvertSize - 1; i++)
    {
        std::string num2str = doubleToString(toConvert.at(i));
        result += num2str + ",";
    }
    std::string num2str = doubleToString(toConvert.at(toConvertSize - 1));
    result += num2str;
}